

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O2

GeneralizedMAAStarPlannerForDecPOMDPDiscrete *
GetGMAAInstance(DecPOMDPDiscreteInterface *decpomdp,Arguments *args,
               PlanningUnitMADPDiscreteParameters *params,string *filename,
               BGIP_SolverCreatorInterface *bgipsc_p)

{
  int iVar1;
  double dVar2;
  int iVar3;
  GMAA_kGMAACluster *this;
  ostream *poVar4;
  E *this_00;
  ulong uVar5;
  string bgFilename;
  
  iVar1 = args->verbose;
  if (args->useBGclustering != 0) {
    switch(args->gmaa) {
    case MAAstar:
      iVar3 = (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[5])(bgipsc_p);
      if ((char)iVar3 == '\0') {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "Error: MAAstar requires an exact BG solver, and ");
        (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[4])(&bgFilename,bgipsc_p);
        poVar4 = std::operator<<(poVar4,(string *)&bgFilename);
        poVar4 = std::operator<<(poVar4," is not");
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_001174da;
      }
      this = (GMAA_kGMAACluster *)operator_new(0x490);
      GMAA_MAAstarCluster::GMAA_MAAstarCluster
                ((GMAA_MAAstarCluster *)this,bgipsc_p,(long)args->horizon,decpomdp,params,iVar1);
      goto LAB_0011735c;
    case kGMAA:
      uVar5 = (ulong)args->k;
      break;
    case FSPC:
      args->k = 1;
      uVar5 = 1;
      break;
    case MAAstarClassic:
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"MAAstarClassic not implemented for clustered version");
      goto LAB_00117479;
    default:
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"unrecognized GMAA type?!");
LAB_00117479:
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    this = (GMAA_kGMAACluster *)operator_new(0x4c0);
    GMAA_kGMAACluster::GMAA_kGMAACluster
              (this,bgipsc_p,(long)args->horizon,decpomdp,params,uVar5,args->BGClusterAlgorithm);
    dVar2 = args->thresholdPjaoh;
    *(double *)(this + 0x4a0) = args->thresholdJB;
    *(double *)(this + 0x4a8) = dVar2;
    goto LAB_0011735c;
  }
  switch(args->gmaa) {
  case MAAstar:
    iVar3 = (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[5])(bgipsc_p);
    if ((char)iVar3 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Error: MAAstar requires an exact BG solver, and ");
      (*bgipsc_p->_vptr_BGIP_SolverCreatorInterface[4])(&bgFilename,bgipsc_p);
      poVar4 = std::operator<<(poVar4,(string *)&bgFilename);
      poVar4 = std::operator<<(poVar4," is not");
      std::endl<char,std::char_traits<char>>(poVar4);
LAB_001174da:
      std::__cxx11::string::~string((string *)&bgFilename);
      exit(1);
    }
    this = (GMAA_kGMAACluster *)operator_new(0x448);
    GMAA_MAAstar::GMAA_MAAstar
              ((GMAA_MAAstar *)this,bgipsc_p,(long)args->horizon,decpomdp,params,iVar1);
    goto LAB_0011735c;
  case kGMAA:
    uVar5 = (ulong)args->k;
    break;
  case FSPC:
    args->k = 1;
    uVar5 = 1;
    break;
  case MAAstarClassic:
    this = (GMAA_kGMAACluster *)operator_new(0x440);
    GMAA_MAAstarClassic::GMAA_MAAstarClassic
              ((GMAA_MAAstarClassic *)this,(long)args->horizon,decpomdp,params,iVar1);
    goto LAB_0011735c;
  default:
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"unrecognized GMAA type?!");
    goto LAB_00117479;
  }
  this = (GMAA_kGMAACluster *)operator_new(0x448);
  GMAA_kGMAA::GMAA_kGMAA((GMAA_kGMAA *)this,bgipsc_p,(long)args->horizon,decpomdp,params,uVar5);
LAB_0011735c:
  if ((args->dryrun == 0) && (args->saveAllBGs != 0)) {
    std::operator+(&bgFilename,filename,"_BG");
    std::__cxx11::string::_M_assign((string *)((GMAA_MAAstarCluster *)this + 0x3b8));
    std::__cxx11::string::~string((string *)&bgFilename);
  }
  GeneralizedMAAStarPlanner::SetVerbose((int)((GMAA_MAAstarCluster *)this + 0x338));
  if (args->GMAAdeadline != 0) {
    GeneralizedMAAStarPlanner::SetDeadline((ulong)((GMAA_MAAstarCluster *)this + 0x338));
  }
  return (GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)this;
}

Assistant:

GeneralizedMAAStarPlannerForDecPOMDPDiscrete* GetGMAAInstance(
    DecPOMDPDiscreteInterface* decpomdp,
    ArgumentHandlers::Arguments &args,
    const PlanningUnitMADPDiscreteParameters &params,
    const string &filename,
    BGIP_SolverCreatorInterface * bgipsc_p
    )
{
    GeneralizedMAAStarPlannerForDecPOMDPDiscrete *gmaa=0;

    int verboseness = args.verbose;
    if(args.useBGclustering)
    {
        switch(args.gmaa)
        {
        case MAAstar:
            if(!bgipsc_p->IsExactSolver())
            {
                cout << "Error: MAAstar requires an exact BG solver, and " <<
                    bgipsc_p->SoftPrintBrief() << " is not" << endl;
                exit(1);
            }
            gmaa=new GMAA_MAAstarCluster(bgipsc_p, args.horizon, decpomdp, &params, verboseness );
            break;
        case FSPC:
            args.k=1; // fall through on purpose
        case kGMAA:
        {
            GMAA_kGMAACluster *gmaaCluster=
                new GMAA_kGMAACluster(bgipsc_p, args.horizon, decpomdp, &params, args.k,
                                      static_cast<BayesianGameWithClusterInfo::BGClusterAlgorithm>(args.BGClusterAlgorithm));
            gmaaCluster->SetTresholdJB(args.thresholdJB);
            gmaaCluster->SetTresholdPjaoh(args.thresholdPjaoh);
            gmaa=gmaaCluster;
            break;
        }
        case MAAstarClassic:
            throw E("MAAstarClassic not implemented for clustered version");
            break;
        default:
            throw E("unrecognized GMAA type?!");
        }
    }
    else // regular, un-clustered BGs
    {
        switch(args.gmaa)
        {
        case MAAstar:
            if(!bgipsc_p->IsExactSolver())
            {
                cout << "Error: MAAstar requires an exact BG solver, and " <<
                    bgipsc_p->SoftPrintBrief() << " is not" << endl;
                exit(1);
            }
            gmaa=new GMAA_MAAstar(bgipsc_p, args.horizon, decpomdp, &params, verboseness );
            break;
        case FSPC:
            args.k=1; // fall through on purpose
        case kGMAA:
            gmaa=new GMAA_kGMAA(bgipsc_p, args.horizon, decpomdp, &params, args.k);
            break;
        case MAAstarClassic:
            gmaa=new GMAA_MAAstarClassic(args.horizon, decpomdp, &params, verboseness );
            break;
        default:
            throw E("unrecognized GMAA type?!");
        }
    }

    if(!args.dryrun)
    {
#if 0 // don't store this stuff every iteration, the files can get
      // very large and will slow down the execution!
        // instead we do it when an exception is thrown (but might not
        // work when running out of memory)
        if(args.saveTimings)
            gmaa->SetIntermediateTimingFilename(timingsFilename);
        if(dynamic_cast<GMAA_MAAstarCluster*>(gmaa))
            static_cast<GMAA_MAAstarCluster*>(gmaa)->
                SetClusterStatsFilename(filename + "_clusterStats");

#endif
        if(args.saveAllBGs)
        {
            string bgFilename=filename + "_BG";
            gmaa->SetSaveAllBGs(bgFilename);
        }
    }
    
    gmaa->SetVerbose(args.verbose);
    if(args.GMAAdeadline)
        gmaa->SetDeadline(args.GMAAdeadline);

    return(gmaa);
}